

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

void __thiscall Rml::Context::ReleaseDragClone(Context *this)

{
  undefined1 local_30 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  if (this->drag_clone != (Element *)0x0) {
    Element::RemoveChild
              ((Element *)local_30,
               (this->cursor_proxy)._M_t.
               super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
               super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
               super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
    if ((_func_int **)local_30._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_30._0_8_ + 0x10))();
    }
    local_30._0_8_ = (_func_int **)0x0;
    this->drag_clone = (Element *)0x0;
    local_30._8_8_ = (ObserverPtrBlock *)0x0;
    p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ElementDocument::SetStyleSheetContainer
              ((ElementDocument *)
               (this->cursor_proxy)._M_t.
               super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
               super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
               super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,
               (SharedPtr<StyleSheetContainer> *)(local_30 + 8));
    if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
    }
  }
  return;
}

Assistant:

void Context::ReleaseDragClone()
{
	if (drag_clone)
	{
		cursor_proxy->RemoveChild(drag_clone);
		drag_clone = nullptr;
		static_cast<ElementDocument&>(*cursor_proxy).SetStyleSheetContainer(nullptr);
	}
}